

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O2

Array __thiscall notch::pre::SquareAugmented::apply(SquareAugmented *this,Array *input)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long *in_RDX;
  _func_int **pp_Var5;
  Array AVar6;
  float local_1c;
  
  lVar2 = *in_RDX;
  local_1c = 0.0;
  core::std::valarray<float>::valarray((valarray<float> *)this,&local_1c,lVar2 * 2);
  pfVar3 = (float *)in_RDX[1];
  pfVar4 = pfVar3 + *in_RDX;
  if (*in_RDX == 0) {
    pfVar4 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  pp_Var5 = (this->super_ADatasetTransformer)._vptr_ADatasetTransformer;
  if (pp_Var5 != (_func_int **)0x0) {
    pp_Var5 = this[1].super_ADatasetTransformer._vptr_ADatasetTransformer;
  }
  for (; pfVar3 != pfVar4; pfVar3 = pfVar3 + 1) {
    fVar1 = *pfVar3;
    *(float *)pp_Var5 = fVar1;
    *(float *)((long)pp_Var5 + lVar2 * 4) = fVar1 * fVar1;
    pp_Var5 = (_func_int **)((long)pp_Var5 + 4);
  }
  AVar6._M_data = (float *)pp_Var5;
  AVar6._M_size = (size_t)this;
  return AVar6;
}

Assistant:

virtual Array apply(const Array &input) {
        size_t n = input.size();
        Array output(0.0, 2 * n);
        auto in = std::begin(input);
        auto inEnd = std::end(input);
        auto out = std::begin(output);
        auto outSquare = out + n;
        for (; in != inEnd; ++in, ++out, ++outSquare) {
            float x = *in;
            *out = x;
            *outSquare = x * x;
        }
        return output;
    }